

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Token __thiscall slang::parsing::Preprocessor::expect(Preprocessor *this,TokenKind kind)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  Info *pIVar3;
  undefined4 uVar6;
  BumpAllocator *alloc;
  Diagnostics *diagnostics;
  Token matchingDelim;
  Token lastConsumed;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  Token actual;
  Token local_50;
  Token local_40;
  
  pTVar1 = &this->currentToken;
  pIVar3 = (this->currentToken).info;
  if (pIVar3 == (Info *)0x0) {
    actual = nextProcessed(this);
    this->currentToken = actual;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar4 = pTVar1->field_0x2;
    uVar5 = pTVar1->numFlags;
    uVar6 = pTVar1->rawLen;
    actual.rawLen = uVar6;
    actual.numFlags.raw = uVar5;
    actual._2_1_ = uVar4;
    actual.kind = uVar2;
    actual.info = pIVar3;
  }
  if (actual.kind == kind) {
    uVar7 = pTVar1->field_0x2;
    NVar8.raw = (pTVar1->numFlags).raw;
    uVar9 = pTVar1->rawLen;
    pIVar3 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar7;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar8.raw;
    (this->lastConsumed).rawLen = uVar9;
    (this->lastConsumed).info = pIVar3;
    Token::Token(&local_50);
    pTVar1->kind = local_50.kind;
    pTVar1->field_0x2 = local_50._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_50.numFlags.raw;
    pTVar1->rawLen = local_50.rawLen;
    (this->currentToken).info = local_50.info;
  }
  else {
    alloc = this->alloc;
    diagnostics = this->diagnostics;
    lastConsumed = this->lastConsumed;
    Token::Token(&local_40);
    matchingDelim.info = local_40.info;
    matchingDelim.kind = local_40.kind;
    matchingDelim._2_1_ = local_40._2_1_;
    matchingDelim.numFlags.raw = local_40.numFlags.raw;
    matchingDelim.rawLen = local_40.rawLen;
    actual = Token::createExpected(alloc,diagnostics,actual,kind,lastConsumed,matchingDelim);
  }
  return actual;
}

Assistant:

Token Preprocessor::expect(TokenKind kind) {
    auto result = peek();
    if (result.kind != kind)
        return Token::createExpected(alloc, diagnostics, result, kind, lastConsumed, Token());

    lastConsumed = currentToken;
    currentToken = Token();
    return result;
}